

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SwitchArg.h
# Opt level: O0

bool __thiscall TCLAP::SwitchArg::combinedSwitchesMatch(SwitchArg *this,string *combinedSwitches)

{
  bool bVar1;
  string *psVar2;
  __type _Var3;
  char cVar4;
  long lVar5;
  char *pcVar6;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  string local_e0 [36];
  uint local_bc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8 [4];
  uint i;
  string local_88 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68 [39];
  byte local_41;
  string local_40 [32];
  string *local_20;
  string *combinedSwitches_local;
  SwitchArg *this_local;
  
  local_20 = combinedSwitches;
  combinedSwitches_local = (string *)this;
  lVar5 = std::__cxx11::string::length();
  local_41 = 0;
  bVar9 = false;
  if (lVar5 != 0) {
    pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)local_20);
    cVar4 = *pcVar6;
    Arg::flagStartString_abi_cxx11_();
    local_41 = 1;
    pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)local_40);
    bVar9 = cVar4 != *pcVar6;
  }
  if ((local_41 & 1) != 0) {
    std::__cxx11::string::~string(local_40);
  }
  psVar2 = local_20;
  if (!bVar9) {
    Arg::nameStartString_abi_cxx11_();
    std::__cxx11::string::length();
    std::__cxx11::string::substr((ulong)local_68,(ulong)psVar2);
    Arg::nameStartString_abi_cxx11_();
    _Var3 = std::operator==(local_68,local_b8);
    std::__cxx11::string::~string((string *)local_b8);
    std::__cxx11::string::~string((string *)local_68);
    std::__cxx11::string::~string(local_88);
    psVar2 = local_20;
    if (!_Var3) {
      cVar4 = Arg::delimiter();
      lVar5 = std::__cxx11::string::find_first_of((char)psVar2,(ulong)(uint)(int)cVar4);
      if (lVar5 == -1) {
        for (local_bc = 1; uVar7 = (ulong)local_bc, uVar8 = std::__cxx11::string::length(),
            uVar7 < uVar8; local_bc = local_bc + 1) {
          lVar5 = std::__cxx11::string::length();
          bVar1 = false;
          bVar9 = false;
          if (lVar5 != 0) {
            pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)local_20);
            cVar4 = *pcVar6;
            pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)&(this->super_Arg)._flag);
            bVar9 = false;
            if (cVar4 == *pcVar6) {
              pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)&(this->super_Arg)._flag);
              cVar4 = *pcVar6;
              Arg::flagStartString_abi_cxx11_();
              bVar1 = true;
              pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)local_e0);
              bVar9 = cVar4 != *pcVar6;
            }
          }
          if (bVar1) {
            std::__cxx11::string::~string(local_e0);
          }
          if (bVar9) {
            cVar4 = Arg::blankChar();
            pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)local_20);
            *pcVar6 = cVar4;
            return true;
          }
        }
      }
    }
  }
  return false;
}

Assistant:

inline bool SwitchArg::combinedSwitchesMatch(std::string& combinedSwitches )
{
  // make sure this is actually a combined switch
  if ( combinedSwitches.length() > 0 &&
       combinedSwitches[0] != Arg::flagStartString()[0] )
    return false;

  // make sure it isn't a long name 
  if ( combinedSwitches.substr( 0, Arg::nameStartString().length() ) == 
       Arg::nameStartString() )
    return false;

  // make sure the delimiter isn't in the string 
  if ( combinedSwitches.find_first_of(Arg::delimiter()) != std::string::npos)
    return false;

  // ok, we're not specifying a ValueArg, so we know that we have
  // a combined switch list.  
  for ( unsigned int i = 1; i < combinedSwitches.length(); i++ )
    if ( _flag.length() > 0 && 
	 combinedSwitches[i] == _flag[0] &&
	 _flag[0] != Arg::flagStartString()[0] ) 
      {
	// update the combined switches so this one is no longer present
	// this is necessary so that no unlabeled args are matched
	// later in the processing.
	//combinedSwitches.erase(i,1);
	combinedSwitches[i] = Arg::blankChar(); 
	return true;
      }

  // none of the switches passed in the list match. 
  return false;   
}